

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O2

type_id value_type_id(value v)

{
  size_t sVar1;
  type_id id;
  
  id = 0x14;
  if (v == (value)0x0) {
    id = 0x14;
  }
  else {
    sVar1 = value_size(v);
    value_to((value)((long)v + (sVar1 - 4)),&id,4);
  }
  return id;
}

Assistant:

type_id value_type_id(value v)
{
	type_id id = TYPE_INVALID;

	if (v != NULL)
	{
		size_t size = value_size(v);

		size_t offset = size - sizeof(type_id);

		value_to((value)(((uintptr_t)v) + offset), &id, sizeof(type_id));
	}

	return id;
}